

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listelem_alloc.c
# Opt level: O2

void listelem_alloc_free(listelem_alloc_t *list)

{
  glist_t pgVar1;
  glist_t *ppgVar2;
  
  if (list != (listelem_alloc_t *)0x0) {
    ppgVar2 = &list->blocks;
    while (pgVar1 = *ppgVar2, pgVar1 != (glist_t)0x0) {
      ckd_free((pgVar1->data).ptr);
      ppgVar2 = &pgVar1->next;
    }
    glist_free(list->blocks);
    glist_free(list->blocksize);
    ckd_free(list);
    return;
  }
  return;
}

Assistant:

void
listelem_alloc_free(listelem_alloc_t *list)
{
    gnode_t *gn;
    if (list == NULL)
	return;
    for (gn = list->blocks; gn; gn = gnode_next(gn))
	ckd_free(gnode_ptr(gn));
    glist_free(list->blocks);
    glist_free(list->blocksize);
    ckd_free(list);
}